

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_profile_dumpstack(lua_State *L)

{
  int32_t depth_00;
  GCstr *len_00;
  long in_RDI;
  char *p;
  GCstr *fmt;
  int depth;
  size_t len;
  int arg;
  lua_State *L2;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  lua_State *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar1;
  
  uVar1 = 0;
  if ((*(ulong *)(in_RDI + 0x10) < *(ulong *)(in_RDI + 0x18)) &&
     (*(int *)(*(long *)(in_RDI + 0x10) + 4) == -7)) {
    uVar1 = 1;
  }
  len_00 = lj_lib_checkstr(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  depth_00 = lj_lib_checkint((lua_State *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             (int)((ulong)len_00 >> 0x20));
  luaJIT_profile_dumpstack
            ((lua_State *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),
             (char *)in_stack_ffffffffffffffe0,depth_00,(size_t *)len_00);
  lua_pushlstring((lua_State *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),
                  (char *)in_stack_ffffffffffffffe0,CONCAT44(depth_00,in_stack_ffffffffffffffd8));
  return 1;
}

Assistant:

LJLIB_CF(jit_profile_dumpstack)
{
  lua_State *L2 = L;
  int arg = 0;
  size_t len;
  int depth;
  GCstr *fmt;
  const char *p;
  if (L->top > L->base && tvisthread(L->base)) {
    L2 = threadV(L->base);
    arg = 1;
  }
  fmt = lj_lib_checkstr(L, arg+1);
  depth = lj_lib_checkint(L, arg+2);
  p = luaJIT_profile_dumpstack(L2, strdata(fmt), depth, &len);
  lua_pushlstring(L, p, len);
  return 1;
}